

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.c
# Opt level: O2

double rhs_2nd_equation(double x,double t,Gas_parameters *parameters)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar2 = sin(t * 6.283185307179586);
  dVar3 = x * 3.141592653589793 * x * 0.01;
  dVar4 = sin(dVar3);
  dVar5 = cos(t * 6.283185307179586);
  dVar6 = sin(dVar3);
  dVar7 = u_x(x,t);
  dVar3 = parameters->p_ro;
  dVar8 = sin(x * 0.3141592653589793);
  dVar9 = cos(x * 0.3141592653589793);
  dVar1 = parameters->viscosity;
  dVar10 = g_exact(x,t);
  dVar10 = exp_1(dVar10);
  dVar11 = u_xx(x,t);
  return (((dVar8 * -0.3141592653589793) / (dVar9 + 1.5)) * dVar3 +
         dVar7 * dVar6 * dVar5 + dVar4 * dVar2 * -6.283185307179586) - dVar10 * dVar1 * dVar11;
}

Assistant:

double rhs_2nd_equation (double x, double t, Gas_parameters const * parameters) {
  return u_t (x, t) + 
          u_exact (x, t) * u_x (x, t) + 
          parameters->p_ro * g_x (x, t) -
          parameters->viscosity * exp_1 (g_exact (x, t)) * u_xx (x, t);
}